

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

uint32_t SharpYuvGammaToLinear(uint16_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  float in_EDX;
  ushort in_DI;
  float fVar1;
  float linear;
  float v_float;
  int in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  uint32_t local_4;
  
  if (in_EDX == 1.82169e-44) {
    local_4 = ToLinearSrgb((uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x10),
                           in_stack_ffffffffffffffdc);
  }
  else {
    switch(in_EDX) {
    case 1.4013e-45:
    case 8.40779e-45:
    case 1.96182e-44:
    case 2.10195e-44:
      ToLinear709(2.44068e-39);
      break;
    default:
      break;
    case 5.60519e-45:
      ToLinear470M(0.0);
      break;
    case 7.00649e-45:
      ToLinear470Bg(0.0);
      break;
    case 9.80909e-45:
      ToLinearSmpte240(2.440772e-39);
      break;
    case 1.12104e-44:
      return (uint)in_DI;
    case 1.26117e-44:
      ToLinearLog100(0.0);
      break;
    case 1.4013e-44:
      ToLinearLog100Sqrt10(0.0);
      break;
    case 1.54143e-44:
      ToLinearIec61966(2.440876e-39);
      break;
    case 1.68156e-44:
      ToLinearBt1361(2.440902e-39);
      break;
    case 2.24208e-44:
      ToLinearPq(in_EDX);
      break;
    case 2.38221e-44:
      ToLinearSmpte428(0.0);
      break;
    case 2.52234e-44:
      ToLinearHlg(2.440982e-39);
    }
    fVar1 = Roundf(2.441038e-39);
    local_4 = (uint32_t)(long)fVar1;
  }
  return local_4;
}

Assistant:

uint32_t SharpYuvGammaToLinear(uint16_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return ToLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << bit_depth) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = ToLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = ToLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = ToLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = ToLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = ToLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = ToLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = ToLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = ToLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = ToLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = ToLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = ToLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint32_t)Roundf(linear * ((1 << 16) - 1));
}